

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O0

void Acec_TreeFindTreesTest(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Vec_Int_t *vAdds_00;
  abctime aVar5;
  Vec_Wec_t *p_00;
  int nFadds;
  Vec_Int_t *vAdds;
  abctime clk;
  Vec_Wec_t *vTrees;
  Gia_Man_t *p_local;
  
  aVar4 = Abc_Clock();
  vAdds_00 = Ree_ManComputeCuts(p,(Vec_Int_t **)0x0,1);
  uVar1 = Ree_ManCountFadds(vAdds_00);
  iVar2 = Vec_IntSize(vAdds_00);
  iVar3 = Vec_IntSize(vAdds_00);
  printf("Detected %d adders (%d FAs and %d HAs).  ",(ulong)(uint)(iVar2 / 6),(ulong)uVar1,
         (ulong)(iVar3 / 6 - uVar1));
  aVar5 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar5 - aVar4);
  aVar4 = Abc_Clock();
  p_00 = Acec_TreeFindTrees(p,vAdds_00,(Vec_Bit_t *)0x0,0,0);
  uVar1 = Vec_WecSize(p_00);
  iVar2 = Vec_WecSizeSize(p_00);
  printf("Collected %d trees with %d adders in them.  ",(ulong)uVar1,(long)iVar2 / 2 & 0xffffffff);
  aVar5 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar5 - aVar4);
  Vec_WecPrint(p_00,0);
  Vec_WecFree(p_00);
  Vec_IntFree(vAdds_00);
  return;
}

Assistant:

void Acec_TreeFindTreesTest( Gia_Man_t * p )
{
    Vec_Wec_t * vTrees;

    abctime clk = Abc_Clock();
    Vec_Int_t * vAdds = Ree_ManComputeCuts( p, NULL, 1 );
    int nFadds = Ree_ManCountFadds( vAdds );
    printf( "Detected %d adders (%d FAs and %d HAs).  ", Vec_IntSize(vAdds)/6, nFadds, Vec_IntSize(vAdds)/6-nFadds );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    vTrees = Acec_TreeFindTrees( p, vAdds, NULL, 0, 0 );
    printf( "Collected %d trees with %d adders in them.  ", Vec_WecSize(vTrees), Vec_WecSizeSize(vTrees)/2 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Vec_WecPrint( vTrees, 0 );

    Vec_WecFree( vTrees );
    Vec_IntFree( vAdds );
}